

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::lookupGeometries
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *this_00;
  Node *pNVar1;
  iterator iVar2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar3;
  GroupNode *this_01;
  mapped_type *pmVar4;
  key_type *in_RDX;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  geometries;
  Transformations local_60;
  
  this_00 = (_Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             *)(node + 1);
  iVar2 = std::
          _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
          ::find(this_00,in_RDX);
  if (iVar2._M_node == (_Base_ptr)(node + 2)) {
    geometries.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    geometries.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    geometries.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60.time_range.lower = 0.0;
    local_60.time_range.upper = 1.0;
    local_60.quaternion = false;
    pAVar3 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(0x40,0x10);
    local_60.spaces.items = pAVar3;
    alignedFree((void *)0x0);
    local_60.spaces.size_alloced = 1;
    local_60.spaces.size_active = 1;
    *(undefined8 *)&(pAVar3->l).vx.field_0 = 0x3f800000;
    *(undefined8 *)((long)&(pAVar3->l).vx.field_0 + 8) = 0;
    *(undefined8 *)&(pAVar3->l).vy.field_0 = 0x3f80000000000000;
    *(undefined8 *)((long)&(pAVar3->l).vy.field_0 + 8) = 0;
    *(undefined8 *)&(pAVar3->l).vz.field_0 = 0;
    *(undefined8 *)((long)&(pAVar3->l).vz.field_0 + 8) = 0x3f800000;
    *(undefined8 *)&(pAVar3->p).field_0 = 0;
    *(undefined8 *)((long)&(pAVar3->p).field_0 + 8) = 0x3f80000000000000;
    convertGeometries((SceneGraphFlattener *)node,&geometries,in_RDX,&local_60);
    SceneGraph::Transformations::~Transformations(&local_60);
    this_01 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,&geometries);
    pmVar4 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)this_00,in_RDX);
    (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
    if (pmVar4->ptr != (Node *)0x0) {
      (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar4->ptr = (Node *)this_01;
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::~vector(&geometries);
  }
  pmVar4 = std::
           map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
           ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         *)this_00,in_RDX);
  pNVar1 = pmVar4->ptr;
  (this->node).ptr = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> lookupGeometries(Ref<SceneGraph::Node> node)
    {
      if (object_mapping.find(node) == object_mapping.end())
      {
        std::vector<Ref<SceneGraph::Node>> geometries;
        convertGeometries(geometries,node,one);
        object_mapping[node] = new SceneGraph::GroupNode(geometries);
      }
      
      return object_mapping[node];
    }